

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

VkGraphicsPipelineLibraryFlagsEXT
Fossilize::graphics_pipeline_get_effective_state_flags(VkGraphicsPipelineCreateInfo *create_info)

{
  VkGraphicsPipelineLibraryCreateInfoEXT *pVVar1;
  VkGraphicsPipelineLibraryCreateInfoEXT *graphics_pipeline_library;
  VkGraphicsPipelineLibraryFlagsEXT state_flags;
  VkGraphicsPipelineCreateInfo *create_info_local;
  
  graphics_pipeline_library._4_4_ = 0xf;
  pVVar1 = find_pnext<VkGraphicsPipelineLibraryCreateInfoEXT>
                     (VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT,create_info->pNext
                     );
  if (((create_info->flags & 0x800) != 0) &&
     (pVVar1 != (VkGraphicsPipelineLibraryCreateInfoEXT *)0x0)) {
    graphics_pipeline_library._4_4_ = pVVar1->flags;
  }
  return graphics_pipeline_library._4_4_;
}

Assistant:

static VkGraphicsPipelineLibraryFlagsEXT graphics_pipeline_get_effective_state_flags(
		const VkGraphicsPipelineCreateInfo &create_info)
{
	VkGraphicsPipelineLibraryFlagsEXT state_flags =
			VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_OUTPUT_INTERFACE_BIT_EXT |
			VK_GRAPHICS_PIPELINE_LIBRARY_PRE_RASTERIZATION_SHADERS_BIT_EXT |
			VK_GRAPHICS_PIPELINE_LIBRARY_VERTEX_INPUT_INTERFACE_BIT_EXT |
			VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_SHADER_BIT_EXT;

	auto *graphics_pipeline_library = find_pnext<VkGraphicsPipelineLibraryCreateInfoEXT>(
			VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT,
			create_info.pNext);

	// If we're not creating a library, assume we're defining a complete pipeline.
	if ((create_info.flags & VK_PIPELINE_CREATE_LIBRARY_BIT_KHR) != 0 && graphics_pipeline_library)
		state_flags = graphics_pipeline_library->flags;

	return state_flags;
}